

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O0

bool duckdb::PhysicalNestedLoopJoin::IsSupported
               (vector<duckdb::JoinCondition,_true> *conditions,JoinType join_type)

{
  bool bVar1;
  PhysicalType PVar2;
  const_iterator __lhs;
  pointer pEVar3;
  size_type sVar4;
  char in_SIL;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *in_RDI;
  JoinCondition *cond;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::JoinCondition,_true> *__range1;
  reference in_stack_ffffffffffffffc8;
  __normal_iterator<const_duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
  local_28 [2];
  char local_11;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *local_10;
  bool local_1;
  
  if (in_SIL == '\a') {
    local_1 = true;
  }
  else {
    local_11 = in_SIL;
    local_10 = in_RDI;
    local_28[0]._M_current =
         (JoinCondition *)
         ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::begin
                   ((vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *)
                    in_stack_ffffffffffffffc8);
    __lhs = ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::end
                      ((vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *)
                       in_stack_ffffffffffffffc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
                               *)__lhs._M_current,
                              (__normal_iterator<const_duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
                               *)in_stack_ffffffffffffffc8), bVar1) {
      in_stack_ffffffffffffffc8 =
           __gnu_cxx::
           __normal_iterator<const_duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
           ::operator*(local_28);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&(__lhs._M_current)->left);
      PVar2 = LogicalType::InternalType(&pEVar3->return_type);
      if (PVar2 == STRUCT) {
        return false;
      }
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&(__lhs._M_current)->left);
      PVar2 = LogicalType::InternalType(&pEVar3->return_type);
      if (PVar2 == LIST) {
        return false;
      }
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&(__lhs._M_current)->left);
      PVar2 = LogicalType::InternalType(&pEVar3->return_type);
      if (PVar2 == ARRAY) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
      ::operator++(local_28);
    }
    if ((local_11 == '\x05') || (local_11 == '\x06')) {
      sVar4 = ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::size
                        (local_10);
      local_1 = sVar4 == 1;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool PhysicalNestedLoopJoin::IsSupported(const vector<JoinCondition> &conditions, JoinType join_type) {
	if (join_type == JoinType::MARK) {
		return true;
	}
	for (auto &cond : conditions) {
		if (cond.left->return_type.InternalType() == PhysicalType::STRUCT ||
		    cond.left->return_type.InternalType() == PhysicalType::LIST ||
		    cond.left->return_type.InternalType() == PhysicalType::ARRAY) {
			return false;
		}
	}
	// To avoid situations like https://github.com/duckdb/duckdb/issues/10046
	// If there is an equality in the conditions, a hash join is planned
	// with one condition, we can use mark join logic, otherwise we should use physical blockwise nl join
	if (join_type == JoinType::SEMI || join_type == JoinType::ANTI) {
		return conditions.size() == 1;
	}
	return true;
}